

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char(&)[46],char,unsigned_short>
          (String *__return_storage_ptr__,kj *this,char (*params) [46],char *params_1,
          unsigned_short *params_2)

{
  undefined1 local_49;
  CappedArray<char,_8UL> local_48;
  kj *local_38;
  size_t local_30;
  
  local_30 = strlen((char *)this);
  local_49 = (*params)[0];
  local_38 = this;
  local_48 = _::Stringifier::operator*((Stringifier *)&_::STR,*(unsigned_short *)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_49,
             (FixedArray<char,_1UL> *)&local_48,(CappedArray<char,_8UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}